

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_name.cc
# Opt level: O2

bool __thiscall bssl::X509NameAttribute::ValueAsStringUnsafe(X509NameAttribute *this,string *out)

{
  bool bVar1;
  Input in;
  Input in_00;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  switch(this->value_tag) {
  case 0x13:
  case 0x14:
  case 0x16:
    goto switchD_0037e642_caseD_13;
  case 0x15:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1d:
switchD_0037e642_caseD_15:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/parse_name.cc"
                  ,0x56,"bool bssl::X509NameAttribute::ValueAsStringUnsafe(std::string *) const");
  case 0x1c:
    in.data_.size_ = (size_t)out;
    in.data_.data_ = (uchar *)(this->value).data_.size_;
    bVar1 = bssl::der::ParseUniversalString
                      ((der *)(this->value).data_.data_,in,
                       (string *)&switchD_0037e642::switchdataD_004633c0);
    return bVar1;
  case 0x1e:
    in_00.data_.size_ = (size_t)out;
    in_00.data_.data_ = (uchar *)(this->value).data_.size_;
    bVar1 = bssl::der::ParseBmpString
                      ((der *)(this->value).data_.data_,in_00,
                       (string *)&switchD_0037e642::switchdataD_004633c0);
    return bVar1;
  default:
    if (this->value_tag != 0xc) goto switchD_0037e642_caseD_15;
switchD_0037e642_caseD_13:
    local_10._M_str = (char *)(this->value).data_.data_;
    local_10._M_len = (this->value).data_.size_;
    ::std::__cxx11::string::assign<std::basic_string_view<char,std::char_traits<char>>>
              ((string *)out,&local_10);
    return true;
  }
}

Assistant:

bool X509NameAttribute::ValueAsStringUnsafe(std::string *out) const {
  switch (value_tag) {
    case CBS_ASN1_IA5STRING:
    case CBS_ASN1_PRINTABLESTRING:
    case CBS_ASN1_T61STRING:
    case CBS_ASN1_UTF8STRING:
      *out = BytesAsStringView(value);
      return true;
    case CBS_ASN1_UNIVERSALSTRING:
      return der::ParseUniversalString(value, out);
    case CBS_ASN1_BMPSTRING:
      return der::ParseBmpString(value, out);
    default:
      assert(0);  // NOTREACHED
      return false;
  }
}